

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O1

void TimeZoneDataDirInitFn(UErrorCode *status)

{
  CharString *this;
  char *pcVar1;
  code *size;
  char *path;
  
  size = putil_cleanup;
  ucln_common_registerCleanup_63(UCLN_COMMON_PUTIL,putil_cleanup);
  this = (CharString *)icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)size);
  if (this == (CharString *)0x0) {
    this = (CharString *)0x0;
  }
  else {
    icu_63::MaybeStackArray<char,_40>::MaybeStackArray((MaybeStackArray<char,_40> *)this);
    this->len = 0;
    *(this->buffer).ptr = '\0';
  }
  gTimeZoneFilesDirectory = this;
  if (this != (CharString *)0x0) {
    pcVar1 = getenv("ICU_TIMEZONE_FILES_DIR");
    path = "";
    if (pcVar1 != (char *)0x0) {
      path = pcVar1;
    }
    setTimeZoneFilesDir(path,status);
    return;
  }
  *status = U_MEMORY_ALLOCATION_ERROR;
  return;
}

Assistant:

static void U_CALLCONV TimeZoneDataDirInitFn(UErrorCode &status) {
    U_ASSERT(gTimeZoneFilesDirectory == NULL);
    ucln_common_registerCleanup(UCLN_COMMON_PUTIL, putil_cleanup);
    gTimeZoneFilesDirectory = new CharString();
    if (gTimeZoneFilesDirectory == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    const char *dir = "";

#if U_PLATFORM_HAS_WINUWP_API != 0
    // The UWP version does not support the environment variable setting, but can possibly pick them up from the Windows directory.
    char datadir_path_buffer[MAX_PATH];
    if (getIcuDataDirectoryUnderWindowsDirectory(datadir_path_buffer, UPRV_LENGTHOF(datadir_path_buffer))) {
        dir = datadir_path_buffer;
    }
#else
    dir = getenv("ICU_TIMEZONE_FILES_DIR");
#endif // U_PLATFORM_HAS_WINUWP_API

#if defined(U_TIMEZONE_FILES_DIR)
    if (dir == NULL) {
        // Build time configuration setting.
        dir = TO_STRING(U_TIMEZONE_FILES_DIR);
    }
#endif

    if (dir == NULL) {
        dir = "";
    }

    setTimeZoneFilesDir(dir, status);
}